

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_mapper.h
# Opt level: O0

nes_mapper * nes_mapper_get(nes_mapper *__return_storage_ptr__,int mapper_id)

{
  int mapper_id_local;
  
  switch(mapper_id) {
  case 1:
    nes_mapper_get_MMC1();
    break;
  case 2:
    nes_mapper_get_UxROM();
    break;
  case 3:
    nes_mapper_get_CNROM();
    break;
  default:
    nes_mapper_get_NROM();
    break;
  case 7:
    nes_mapper_get_AxROM();
  }
  return __return_storage_ptr__;
}

Assistant:

static nes_mapper nes_mapper_get(int mapper_id)
{
    switch(mapper_id)
    {
        case 1: return nes_mapper_get_MMC1();
        case 2: return nes_mapper_get_UxROM();
        case 3: return nes_mapper_get_CNROM();
        case 7: return nes_mapper_get_AxROM();
    }
    return nes_mapper_get_NROM();
}